

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

ebml_element *
CreateElement(anynode *Any,uint8_t *PossibleId,int8_t IdLength,ebml_context *Context,
             ebml_master *Parent,int ForProfile)

{
  fourcc_t fVar1;
  bool_t bVar2;
  ebml_dummy *Dummy;
  ebml_element *Result;
  int ForProfile_local;
  ebml_master *Parent_local;
  ebml_context *Context_local;
  int8_t IdLength_local;
  uint8_t *PossibleId_local;
  anynode *Any_local;
  
  if (Context == (ebml_context *)0x0) {
    __assert_fail("Context!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0xd1,
                  "ebml_element *CreateElement(anynode *, const uint8_t *, int8_t, const ebml_context *, ebml_master *, int)"
                 );
  }
  bVar2 = EBML_IdMatch(PossibleId,IdLength,Context->Id);
  if (bVar2 == 0) {
    Dummy = (ebml_dummy *)EBML_ElementCreate(Any,&EBML_ContextDummy,0,ForProfile);
    if (Dummy != (ebml_dummy *)0x0) {
      memcpy(&Dummy->DummyContext,&EBML_ContextDummy,0x30);
      fVar1 = EBML_IdFromBuffer(PossibleId,IdLength);
      (Dummy->DummyContext).Id = fVar1;
      (Dummy->Base).Base.Context = &Dummy->DummyContext;
    }
  }
  else {
    Dummy = (ebml_dummy *)EBML_ElementCreate(Any,Context,0,ForProfile);
  }
  if ((Dummy != (ebml_dummy *)0x0) && (Parent != (ebml_master *)0x0)) {
    bVar2 = Node_IsPartOf(Parent,0x544d4245);
    if (bVar2 == 0) {
      __assert_fail("Node_IsPartOf(Parent,EBML_MASTER_CLASS)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0xe4,
                    "ebml_element *CreateElement(anynode *, const uint8_t *, int8_t, const ebml_context *, ebml_master *, int)"
                   );
    }
    EBML_MasterAppend(Parent,(ebml_element *)Dummy);
  }
  return (ebml_element *)Dummy;
}

Assistant:

static ebml_element *CreateElement(anynode *Any, const uint8_t *PossibleId, int8_t IdLength, const ebml_context *Context, ebml_master *Parent, int ForProfile)
{
    ebml_element *Result;
    assert(Context!=NULL);
    if (EBML_IdMatch(PossibleId, IdLength, Context->Id))
    {
        Result = EBML_ElementCreate(Any,Context,0, ForProfile);
    }
    else
    {
        Result = EBML_ElementCreate(Any,&EBML_ContextDummy,0, ForProfile);
        if (Result!=NULL)
        {
            // Fill a temp context
            ebml_dummy *Dummy = (ebml_dummy*)Result;
            memcpy(&Dummy->DummyContext,&EBML_ContextDummy,sizeof(Dummy->DummyContext));
            Dummy->DummyContext.Id = EBML_IdFromBuffer(PossibleId,IdLength);
            Result->Context = &Dummy->DummyContext;
        }
    }
    if (Result && Parent)
    {
        assert(Node_IsPartOf(Parent,EBML_MASTER_CLASS));
        EBML_MasterAppend(Parent,Result);
    }
    return Result;
}